

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBalance.c
# Opt level: O3

int Abc_NtkBalanceLevel_rec(Abc_Obj_t *pNode)

{
  Abc_Obj_t *pAVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  Abc_Obj_t *pNode_00;
  
  if (((ulong)pNode & 1) != 0) {
    __assert_fail("!Abc_ObjIsComplement(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcBalance.c"
                  ,0x22f,"int Abc_NtkBalanceLevel_rec(Abc_Obj_t *)");
  }
  uVar2 = *(uint *)&pNode->field_0x14;
  if (uVar2 < 0x1000) {
    uVar3 = 0;
    if (((uVar2 & 0xf) != 2) && (uVar3 = 0, (uVar2 & 0xf) != 5)) {
      pAVar1 = (pNode->field_6).pCopy;
      if (pAVar1 == (Abc_Obj_t *)0x0) {
        __assert_fail("vSuper != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcBalance.c"
                      ,0x235,"int Abc_NtkBalanceLevel_rec(Abc_Obj_t *)");
      }
      if (*(int *)((long)&pAVar1->pNtk + 4) < 1) {
        uVar3 = 0x1000;
      }
      else {
        lVar4 = 0;
        uVar3 = 0;
        do {
          pNode_00 = (Abc_Obj_t *)((ulong)(&pAVar1->pNext->pNtk)[lVar4] & 0xfffffffffffffffe);
          Abc_NtkBalanceLevel_rec(pNode_00);
          uVar2 = *(uint *)&pNode_00->field_0x14 >> 0xc;
          if (uVar2 < uVar3) {
            uVar2 = uVar3;
          }
          uVar3 = uVar2;
          lVar4 = lVar4 + 1;
        } while (lVar4 < *(int *)((long)&pAVar1->pNtk + 4));
        uVar2 = *(uint *)&pNode->field_0x14;
        uVar3 = uVar3 * 0x1000 + 0x1000;
      }
      *(uint *)&pNode->field_0x14 = uVar2 & 0xfff | uVar3;
      uVar3 = uVar3 >> 0xc;
    }
  }
  else {
    uVar3 = uVar2 >> 0xc;
  }
  return uVar3;
}

Assistant:

int Abc_NtkBalanceLevel_rec( Abc_Obj_t * pNode )
{
    Vec_Ptr_t * vSuper;
    Abc_Obj_t * pFanin;
    int i, LevelMax;
    assert( !Abc_ObjIsComplement(pNode) );
    if ( pNode->Level > 0 )
        return pNode->Level;
    if ( Abc_ObjIsCi(pNode) )
        return 0;
    vSuper = (Vec_Ptr_t *)pNode->pCopy;
    assert( vSuper != NULL );
    LevelMax = 0;
    Vec_PtrForEachEntry( Abc_Obj_t *, vSuper, pFanin, i )
    {
        pFanin = Abc_ObjRegular(pFanin);
        Abc_NtkBalanceLevel_rec(pFanin);
        if ( LevelMax < (int)pFanin->Level )
            LevelMax = pFanin->Level;
    }
    pNode->Level = LevelMax + 1;
    return pNode->Level;
}